

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)

{
  DataBlobSource *this;
  pointer pcVar1;
  hrgls_Status hVar2;
  
  if (stream == (hrgls_DataBlobSource)0x0) {
    hVar2 = 0x3ec;
  }
  else {
    this = stream->stream;
    if (this == (DataBlobSource *)0x0) {
      hVar2 = 0x3ec;
    }
    else {
      hrgls::datablob::DataBlobSource::~DataBlobSource(this);
      operator_delete(this);
      stream->stream = (DataBlobSource *)0x0;
      hVar2 = 0;
    }
    pcVar1 = (stream->info).name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(stream->info).name.field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(stream);
  }
  return hVar2;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!stream) {
      s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
    } else {
      if (!stream->stream) {
        s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
      } else {
        try {
          delete stream->stream;
        } catch (...) {
          s = hrgls_STATUS_DELETION_FAILED;
        }
        stream->stream = nullptr;
      }
      try {
        delete stream;
      } catch (...) {
        s = hrgls_STATUS_DELETION_FAILED;
      }
    }
    return s;
  }